

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Chapters::Atom::Init(Atom *this)

{
  Atom *this_local;
  
  this->m_string_uid = (char *)0x0;
  this->m_uid = 0;
  this->m_start_timecode = -1;
  this->m_stop_timecode = -1;
  this->m_displays = (Display *)0x0;
  this->m_displays_size = 0;
  this->m_displays_count = 0;
  return;
}

Assistant:

void Chapters::Atom::Init() {
  m_string_uid = NULL;
  m_uid = 0;
  m_start_timecode = -1;
  m_stop_timecode = -1;

  m_displays = NULL;
  m_displays_size = 0;
  m_displays_count = 0;
}